

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O1

void __thiscall ParameterInfo::ParameterInfo(ParameterInfo *this,ParameterInfo *info)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  Uint8 *__dest;
  float *__dest_00;
  Sint16 *pSVar5;
  float *pfVar6;
  uint uVar7;
  ulong uVar8;
  ulong __n;
  size_t __n_00;
  
  cVar1 = info->name_length;
  this->name_length = cVar1;
  this->group_id = info->group_id;
  this->name = (char *)0x0;
  this->next_offset = info->next_offset;
  cVar2 = info->data_type;
  this->data_type = cVar2;
  __n = (ulong)info->n_dimensions;
  this->n_dimensions = info->n_dimensions;
  this->dimensions = (Uint8 *)0x0;
  this->char_data = (char *)0x0;
  this->int_data = (Sint16 *)0x0;
  this->float_data = (float *)0x0;
  this->descr_length = info->descr_length;
  this->description = (char *)0x0;
  this->locked = info->locked;
  uVar8 = (long)cVar1 + 1;
  pcVar4 = (char *)operator_new__(uVar8);
  this->name = pcVar4;
  memcpy(pcVar4,info->name,uVar8);
  if (info->dimensions != (Uint8 *)0x0) {
    __dest = (Uint8 *)operator_new__((ulong)info->n_dimensions);
    this->dimensions = __dest;
    memcpy(__dest,info->dimensions,__n);
    uVar7 = 1;
    if (__n != 0) {
      uVar8 = 0;
      do {
        uVar7 = uVar7 * __dest[uVar8];
        uVar8 = uVar8 + 1;
      } while (__n != uVar8);
    }
    if ((cVar2 == -1) || (cVar2 == '\x01')) {
      __n_00 = (size_t)uVar7;
      __dest_00 = (float *)operator_new__(__n_00);
      this->char_data = (char *)__dest_00;
      pfVar6 = (float *)info->char_data;
    }
    else if (info->data_type == '\x04') {
      __n_00 = (ulong)uVar7 << 2;
      __dest_00 = (float *)operator_new__(__n_00);
      this->float_data = __dest_00;
      pfVar6 = info->float_data;
    }
    else {
      if (info->data_type != '\x02') {
        return;
      }
      __n_00 = (size_t)(uVar7 * 2);
      __dest_00 = (float *)operator_new__(__n_00);
      this->int_data = (Sint16 *)__dest_00;
      pfVar6 = (float *)info->int_data;
    }
    memcpy(__dest_00,pfVar6,__n_00);
    return;
  }
  bVar3 = info->data_type;
  if (bVar3 < 4) {
    if (bVar3 != 1) {
      if (bVar3 != 2) {
        return;
      }
      pSVar5 = (Sint16 *)operator_new__(2);
      this->int_data = pSVar5;
      *pSVar5 = *info->int_data;
      return;
    }
  }
  else {
    if (bVar3 == 4) {
      pfVar6 = (float *)operator_new__(4);
      this->float_data = pfVar6;
      *pfVar6 = *info->float_data;
      return;
    }
    if (bVar3 != 0xff) {
      return;
    }
  }
  pcVar4 = (char *)operator_new__(1);
  this->char_data = pcVar4;
  *pcVar4 = *info->char_data;
  return;
}

Assistant:

ParameterInfo(const ParameterInfo &info) :
		name_length(info.name_length),
		group_id(info.group_id),
		name(NULL),
		next_offset(info.next_offset),
		data_type(info.data_type),
		n_dimensions(info.n_dimensions),
		dimensions(NULL),

		char_data(NULL),
		int_data(NULL),
		float_data(NULL),

		descr_length(info.descr_length),
		description(NULL),
		locked(info.locked)
		{
			// we also need to copy the '\0' character at the end!
			name = new char[name_length + 1];
			memcpy (name, info.name, sizeof(char) * (name_length + 1));

			if (info.dimensions == 0) {
				// if dim == 0 the data comes right away
				if (info.data_type == 1 || info.data_type == -1) {
					char_data = new char[1];
					memcpy (char_data, info.char_data, sizeof (char));
				} else if (info.data_type == 2) {
					int_data = new Sint16[1];
					memcpy (int_data, info.int_data, sizeof (Sint16));
				} else if (info.data_type == 4) {
					float_data = new float[1];
					memcpy (float_data, info.float_data, sizeof (float));
				}
			} else {
				// we first have to read out the dimensions of the values and then we can
				// store the values
				dimensions = new Uint8[info.n_dimensions];

				memcpy(dimensions, info.dimensions, sizeof(Uint8) * n_dimensions);

				int count = 1;
				int i;
				for (i = 0; i < n_dimensions; i++) {
					count *= dimensions[i];
				}

				if (data_type == 1 || data_type == -1) {
					char_data = new char[count];
					memcpy (char_data, info.char_data, sizeof (char) * count);
				} else if (info.data_type == 2) {
					int_data = new Sint16[count];
					memcpy (int_data, info.int_data, sizeof (Sint16) * count);
				} else if (info.data_type == 4) {
					float_data = new float[count];
					memcpy (float_data, info.float_data, sizeof (float) * count);
				}
			}
		}